

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

_rtext * rtext_new(_glist *glist,t_text *who)

{
  _rtext *bufp;
  t_object *ptVar1;
  _glist *p_Var2;
  
  bufp = (_rtext *)getbytes(0x78);
  bufp->x_text = who;
  bufp->x_glist = glist;
  bufp->x_next = glist->gl_editor->e_rtext;
  bufp->x_drawnwidth = 0;
  bufp->x_drawnheight = 0;
  bufp->x_active = 0;
  bufp->x_selstart = 0;
  bufp->x_selend = 0;
  binbuf_gettext(who->te_binbuf,(char **)bufp,&bufp->x_bufsize);
  ptVar1 = (t_object *)
           resizebytes((t_object *)bufp->x_buf,(long)bufp->x_bufsize,(long)bufp->x_bufsize + 1);
  bufp->x_buf = (char *)ptVar1;
  *(undefined1 *)((long)&(ptVar1->te_g).g_pd + (long)bufp->x_bufsize) = 0;
  p_Var2 = (_glist *)glist->gl_editor;
  (p_Var2->gl_obj).te_outlet = (_outlet *)bufp;
  p_Var2 = glist_getcanvas(p_Var2);
  sprintf(bufp->x_tag,".x%lx.t%lx",p_Var2,bufp);
  return bufp;
}

Assistant:

t_rtext *rtext_new(t_glist *glist, t_text *who)
{
    t_rtext *x = (t_rtext *)getbytes(sizeof *x);
    int w = 0, h = 0, indx;
    x->x_text = who;
    x->x_glist = glist;
    x->x_next = glist->gl_editor->e_rtext;
    x->x_selstart = x->x_selend = x->x_active =
        x->x_drawnwidth = x->x_drawnheight = 0;
    binbuf_gettext(who->te_binbuf, &x->x_buf, &x->x_bufsize);
        /* allocate extra space for hidden null terminator */
    x->x_buf = resizebytes(x->x_buf, x->x_bufsize, x->x_bufsize+1);
    x->x_buf[x->x_bufsize] = 0;
    glist->gl_editor->e_rtext = x;
    sprintf(x->x_tag, ".x%lx.t%lx", (t_int)glist_getcanvas(x->x_glist),
        (t_int)x);
    return (x);
}